

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformmenu.h
# Opt level: O3

void __thiscall QPlatformMenu::~QPlatformMenu(QPlatformMenu *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class Q_GUI_EXPORT QPlatformMenu : public QObject
{
Q_OBJECT
public:
    QPlatformMenu();

    enum MenuType { DefaultMenu = 0, EditMenu };
    Q_ENUM(MenuType)

    virtual void insertMenuItem(QPlatformMenuItem *menuItem, QPlatformMenuItem *before) = 0;
    virtual void removeMenuItem(QPlatformMenuItem *menuItem) = 0;
    virtual void syncMenuItem(QPlatformMenuItem *menuItem) = 0;
    virtual void syncSeparatorsCollapsible(bool enable) = 0;

    virtual void setTag(quintptr tag);
    virtual quintptr tag() const;

    virtual void setText(const QString &text) = 0;
    virtual void setIcon(const QIcon &icon) = 0;
    virtual void setEnabled(bool enabled) = 0;
    virtual bool isEnabled() const { return true; }
    virtual void setVisible(bool visible) = 0;
    virtual void setMinimumWidth(int width) { Q_UNUSED(width); }
    virtual void setFont(const QFont &font) { Q_UNUSED(font); }
    virtual void setMenuType(MenuType type) { Q_UNUSED(type); }

    virtual void showPopup(const QWindow *parentWindow, const QRect &targetRect, const QPlatformMenuItem *item)
    {
        Q_UNUSED(parentWindow);
        Q_UNUSED(targetRect);
        Q_UNUSED(item);
        setVisible(true);
    }

    virtual void dismiss() { } // Closes this and all its related menu popups

    virtual QPlatformMenuItem *menuItemAt(int position) const = 0;
    virtual QPlatformMenuItem *menuItemForTag(quintptr tag) const = 0;

    virtual QPlatformMenuItem *createMenuItem() const;
    virtual QPlatformMenu *createSubMenu() const;
Q_SIGNALS:
    void aboutToShow();
    void aboutToHide();

private:
    quintptr m_tag;
}